

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_sse2.c
# Opt level: O0

void TransformColorInverse_SSE2(VP8LMultipliers *m,uint32_t *src,int num_pixels,uint32_t *dst)

{
  ulong uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  int iVar6;
  ulong *puVar7;
  long in_RCX;
  int in_EDX;
  long in_RSI;
  byte *in_RDI;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  __m128i out;
  __m128i J;
  __m128i I;
  __m128i H;
  __m128i G;
  __m128i F;
  __m128i E;
  __m128i D;
  __m128i C;
  __m128i B;
  __m128i A;
  __m128i in;
  int i;
  __m128i mask_ag;
  __m128i mults_b2;
  __m128i mults_rb;
  ushort in_stack_fffffffffffffd38;
  ushort in_stack_fffffffffffffd3a;
  ushort in_stack_fffffffffffffd3c;
  ushort in_stack_fffffffffffffd3e;
  ushort in_stack_fffffffffffffd44;
  ushort in_stack_fffffffffffffd46;
  char in_stack_fffffffffffffd48;
  byte in_stack_fffffffffffffd49;
  char in_stack_fffffffffffffd4a;
  byte in_stack_fffffffffffffd4b;
  char in_stack_fffffffffffffd4c;
  byte in_stack_fffffffffffffd4d;
  char in_stack_fffffffffffffd4e;
  byte in_stack_fffffffffffffd4f;
  char in_stack_fffffffffffffd50;
  byte in_stack_fffffffffffffd51;
  char in_stack_fffffffffffffd52;
  byte in_stack_fffffffffffffd53;
  char in_stack_fffffffffffffd54;
  byte in_stack_fffffffffffffd55;
  char in_stack_fffffffffffffd56;
  byte in_stack_fffffffffffffd57;
  int local_20c;
  ushort uStack_1a6;
  ushort uStack_1a4;
  ushort uStack_1a2;
  ushort uStack_19e;
  ushort uStack_19c;
  ushort uStack_19a;
  char local_128;
  char cStack_127;
  char cStack_126;
  byte bStack_125;
  char cStack_124;
  char cStack_123;
  char cStack_122;
  byte bStack_121;
  char cStack_120;
  char cStack_11f;
  char cStack_11e;
  byte bStack_11d;
  char cStack_11c;
  char cStack_11b;
  char cStack_11a;
  byte bStack_119;
  char local_118;
  char cStack_117;
  char cStack_116;
  char cStack_114;
  char cStack_113;
  char cStack_112;
  char cStack_110;
  char cStack_10f;
  char cStack_10e;
  char cStack_10c;
  char cStack_10b;
  char cStack_10a;
  char local_108;
  char cStack_107;
  char cStack_106;
  char cStack_105;
  char cStack_104;
  char cStack_103;
  char cStack_102;
  char cStack_101;
  char cStack_100;
  char cStack_ff;
  char cStack_fe;
  char cStack_fd;
  char cStack_fc;
  char cStack_fb;
  char cStack_fa;
  char cStack_f9;
  char local_f8;
  char cStack_f7;
  char cStack_f6;
  char cStack_f5;
  char cStack_f4;
  char cStack_f3;
  char cStack_f2;
  char cStack_f1;
  char cStack_f0;
  char cStack_ef;
  char cStack_ee;
  char cStack_ed;
  char cStack_ec;
  char cStack_eb;
  char cStack_ea;
  char cStack_e9;
  
  uVar5 = (int)(short)((ushort)*in_RDI << 8) << 0xb |
          (uint)(int)(short)((ushort)in_RDI[1] << 8) >> 5 & 0xffff;
  auVar4._4_4_ = uVar5;
  auVar4._0_4_ = uVar5;
  auVar4._12_4_ = uVar5;
  auVar4._8_4_ = uVar5;
  iVar6 = (int)(short)((ushort)in_RDI[2] << 8) << 0xb;
  auVar3._4_4_ = iVar6;
  auVar3._0_4_ = iVar6;
  auVar3._12_4_ = iVar6;
  auVar3._8_4_ = iVar6;
  for (local_20c = 0; local_20c + 4 <= in_EDX; local_20c = local_20c + 4) {
    puVar7 = (ulong *)(in_RSI + (long)local_20c * 4);
    uVar1 = *puVar7;
    uVar2 = puVar7[1];
    auVar8._8_8_ = uVar2 & 0xff00ff00ff00ff00;
    auVar8._0_8_ = uVar1 & 0xff00ff00ff00ff00;
    auVar8 = pshuflw(auVar8,auVar8,0xa0);
    auVar8 = pshufhw(auVar8,auVar8,0xa0);
    auVar8 = pmulhw(auVar8,auVar4);
    local_f8 = (char)uVar1;
    cStack_f7 = (char)(uVar1 >> 8);
    cStack_f6 = (char)(uVar1 >> 0x10);
    cStack_f5 = (char)(uVar1 >> 0x18);
    cStack_f4 = (char)(uVar1 >> 0x20);
    cStack_f3 = (char)(uVar1 >> 0x28);
    cStack_f2 = (char)(uVar1 >> 0x30);
    cStack_f1 = (char)(uVar1 >> 0x38);
    cStack_f0 = (char)uVar2;
    cStack_ef = (char)(uVar2 >> 8);
    cStack_ee = (char)(uVar2 >> 0x10);
    cStack_ed = (char)(uVar2 >> 0x18);
    cStack_ec = (char)(uVar2 >> 0x20);
    cStack_eb = (char)(uVar2 >> 0x28);
    cStack_ea = (char)(uVar2 >> 0x30);
    cStack_e9 = (char)(uVar2 >> 0x38);
    local_108 = auVar8[0];
    cStack_107 = auVar8[1];
    cStack_106 = auVar8[2];
    cStack_105 = auVar8[3];
    cStack_104 = auVar8[4];
    cStack_103 = auVar8[5];
    cStack_102 = auVar8[6];
    cStack_101 = auVar8[7];
    cStack_100 = auVar8[8];
    cStack_ff = auVar8[9];
    cStack_fe = auVar8[10];
    cStack_fd = auVar8[0xb];
    cStack_fc = auVar8[0xc];
    cStack_fb = auVar8[0xd];
    cStack_fa = auVar8[0xe];
    cStack_f9 = auVar8[0xf];
    auVar9[1] = cStack_f7 + cStack_107;
    auVar9[0] = local_f8 + local_108;
    auVar9[2] = cStack_f6 + cStack_106;
    auVar9[3] = cStack_f5 + cStack_105;
    auVar9[4] = cStack_f4 + cStack_104;
    auVar9[5] = cStack_f3 + cStack_103;
    auVar9[6] = cStack_f2 + cStack_102;
    auVar9[7] = cStack_f1 + cStack_101;
    auVar9[9] = cStack_ef + cStack_ff;
    auVar9[8] = cStack_f0 + cStack_100;
    auVar9[10] = cStack_ee + cStack_fe;
    auVar9[0xb] = cStack_ed + cStack_fd;
    auVar9[0xc] = cStack_ec + cStack_fc;
    auVar9[0xd] = cStack_eb + cStack_fb;
    auVar9[0xe] = cStack_ea + cStack_fa;
    auVar9[0xf] = cStack_e9 + cStack_f9;
    auVar8 = psllw(auVar9,ZEXT416(8));
    auVar9 = pmulhw(auVar8,auVar3);
    local_118 = auVar9[1];
    cStack_117 = auVar9[2];
    cStack_116 = auVar9[3];
    cStack_114 = auVar9[5];
    cStack_113 = auVar9[6];
    cStack_112 = auVar9[7];
    cStack_110 = auVar9[9];
    cStack_10f = auVar9[10];
    cStack_10e = auVar9[0xb];
    cStack_10c = auVar9[0xd];
    cStack_10b = auVar9[0xe];
    cStack_10a = auVar9[0xf];
    local_128 = auVar8[0];
    cStack_127 = auVar8[1];
    cStack_126 = auVar8[2];
    bStack_125 = auVar8[3];
    cStack_124 = auVar8[4];
    cStack_123 = auVar8[5];
    cStack_122 = auVar8[6];
    bStack_121 = auVar8[7];
    cStack_120 = auVar8[8];
    cStack_11f = auVar8[9];
    cStack_11e = auVar8[10];
    bStack_11d = auVar8[0xb];
    cStack_11c = auVar8[0xc];
    cStack_11b = auVar8[0xd];
    cStack_11a = auVar8[0xe];
    bStack_119 = auVar8[0xf];
    in_stack_fffffffffffffd48 = local_118 + local_128;
    in_stack_fffffffffffffd49 = cStack_117 + cStack_127;
    in_stack_fffffffffffffd4a = cStack_116 + cStack_126;
    in_stack_fffffffffffffd4c = cStack_114 + cStack_124;
    in_stack_fffffffffffffd4d = cStack_113 + cStack_123;
    in_stack_fffffffffffffd4e = cStack_112 + cStack_122;
    in_stack_fffffffffffffd50 = cStack_110 + cStack_120;
    in_stack_fffffffffffffd51 = cStack_10f + cStack_11f;
    in_stack_fffffffffffffd52 = cStack_10e + cStack_11e;
    in_stack_fffffffffffffd54 = cStack_10c + cStack_11c;
    in_stack_fffffffffffffd55 = cStack_10b + cStack_11b;
    in_stack_fffffffffffffd56 = cStack_10a + cStack_11a;
    in_stack_fffffffffffffd38 = (ushort)in_stack_fffffffffffffd49;
    in_stack_fffffffffffffd3a = (ushort)(((uint)bStack_125 << 0x18) >> 0x18);
    in_stack_fffffffffffffd3c = (ushort)(((uint6)in_stack_fffffffffffffd4d << 0x28) >> 0x28);
    in_stack_fffffffffffffd3e = (ushort)(((ulong)bStack_121 << 0x38) >> 0x38);
    in_stack_fffffffffffffd44 = (ushort)(((uint6)in_stack_fffffffffffffd55 << 0x28) >> 0x28);
    in_stack_fffffffffffffd46 = (ushort)(((ulong)bStack_119 << 0x38) >> 0x38);
    puVar7 = (ulong *)(in_RCX + (long)local_20c * 4);
    *puVar7 = CONCAT26(in_stack_fffffffffffffd3e,
                       CONCAT24(in_stack_fffffffffffffd3c,
                                CONCAT22(in_stack_fffffffffffffd3a,in_stack_fffffffffffffd38))) |
              uVar1 & 0xff00ff00ff00ff00;
    puVar7[1] = CONCAT26(in_stack_fffffffffffffd46,
                         CONCAT24(in_stack_fffffffffffffd44,
                                  CONCAT22((ushort)(((uint)bStack_11d << 0x18) >> 0x18),
                                           (ushort)in_stack_fffffffffffffd51))) |
                uVar2 & 0xff00ff00ff00ff00;
    in_stack_fffffffffffffd4b = bStack_125;
    in_stack_fffffffffffffd4f = bStack_121;
    in_stack_fffffffffffffd53 = bStack_11d;
    in_stack_fffffffffffffd57 = bStack_119;
  }
  if (local_20c != in_EDX) {
    VP8LTransformColorInverse_C
              ((VP8LMultipliers *)
               CONCAT17(in_stack_fffffffffffffd57,
                        CONCAT16(in_stack_fffffffffffffd56,
                                 CONCAT15(in_stack_fffffffffffffd55,
                                          CONCAT14(in_stack_fffffffffffffd54,
                                                   CONCAT13(in_stack_fffffffffffffd53,
                                                            CONCAT12(in_stack_fffffffffffffd52,
                                                                     CONCAT11(
                                                  in_stack_fffffffffffffd51,
                                                  in_stack_fffffffffffffd50))))))),
               (uint32_t *)
               CONCAT17(in_stack_fffffffffffffd4f,
                        CONCAT16(in_stack_fffffffffffffd4e,
                                 CONCAT15(in_stack_fffffffffffffd4d,
                                          CONCAT14(in_stack_fffffffffffffd4c,
                                                   CONCAT13(in_stack_fffffffffffffd4b,
                                                            CONCAT12(in_stack_fffffffffffffd4a,
                                                                     CONCAT11(
                                                  in_stack_fffffffffffffd49,
                                                  in_stack_fffffffffffffd48))))))),
               CONCAT22(in_stack_fffffffffffffd46,in_stack_fffffffffffffd44),
               (uint32_t *)
               CONCAT26(in_stack_fffffffffffffd3e,
                        CONCAT24(in_stack_fffffffffffffd3c,
                                 CONCAT22(in_stack_fffffffffffffd3a,in_stack_fffffffffffffd38))));
  }
  return;
}

Assistant:

static void TransformColorInverse_SSE2(const VP8LMultipliers* const m,
                                       const uint32_t* const src,
                                       int num_pixels, uint32_t* dst) {
// sign-extended multiplying constants, pre-shifted by 5.
#define CST(X)  (((int16_t)(m->X << 8)) >> 5)   // sign-extend
#define MK_CST_16(HI, LO) \
  _mm_set1_epi32((int)(((uint32_t)(HI) << 16) | ((LO) & 0xffff)))
  const __m128i mults_rb = MK_CST_16(CST(green_to_red_), CST(green_to_blue_));
  const __m128i mults_b2 = MK_CST_16(CST(red_to_blue_), 0);
#undef MK_CST_16
#undef CST
  const __m128i mask_ag = _mm_set1_epi32((int)0xff00ff00);  // alpha-green masks
  int i;
  for (i = 0; i + 4 <= num_pixels; i += 4) {
    const __m128i in = _mm_loadu_si128((const __m128i*)&src[i]); // argb
    const __m128i A = _mm_and_si128(in, mask_ag);     // a   0   g   0
    const __m128i B = _mm_shufflelo_epi16(A, _MM_SHUFFLE(2, 2, 0, 0));
    const __m128i C = _mm_shufflehi_epi16(B, _MM_SHUFFLE(2, 2, 0, 0));  // g0g0
    const __m128i D = _mm_mulhi_epi16(C, mults_rb);    // x dr  x db1
    const __m128i E = _mm_add_epi8(in, D);             // x r'  x   b'
    const __m128i F = _mm_slli_epi16(E, 8);            // r' 0   b' 0
    const __m128i G = _mm_mulhi_epi16(F, mults_b2);    // x db2  0  0
    const __m128i H = _mm_srli_epi32(G, 8);            // 0  x db2  0
    const __m128i I = _mm_add_epi8(H, F);              // r' x  b'' 0
    const __m128i J = _mm_srli_epi16(I, 8);            // 0  r'  0  b''
    const __m128i out = _mm_or_si128(J, A);
    _mm_storeu_si128((__m128i*)&dst[i], out);
  }
  // Fall-back to C-version for left-overs.
  if (i != num_pixels) {
    VP8LTransformColorInverse_C(m, src + i, num_pixels - i, dst + i);
  }
}